

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

void __thiscall CTcFormalTypeList::add_untyped_param(CTcFormalTypeList *this)

{
  CTcFormalTypeEle *this_00;
  CTcPrsMem *in_RDI;
  size_t in_stack_fffffffffffffff0;
  
  this_00 = (CTcFormalTypeEle *)operator_new(in_stack_fffffffffffffff0,in_RDI);
  CTcFormalTypeEle::CTcFormalTypeEle(this_00);
  add((CTcFormalTypeList *)in_RDI,this_00);
  return;
}

Assistant:

void CTcFormalTypeList::add_untyped_param()
{
    add(new (G_prsmem) CTcFormalTypeEle());
}